

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O1

bool slang::syntax::SyntaxFacts::isConstraintQualifier(TokenKind kind)

{
  bool bVar1;
  undefined2 in_register_0000003a;
  int iVar2;
  
  iVar2 = CONCAT22(in_register_0000003a,kind);
  bVar1 = true;
  if (((iVar2 != 0xa8) && (iVar2 != 0xf9)) && (iVar2 != 0x11d)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool SyntaxFacts::isConstraintQualifier(TokenKind kind) {
    switch (kind) {
        case TokenKind::StaticKeyword:
        case TokenKind::PureKeyword:
        case TokenKind::ExternKeyword:
            return true;
        default:
            return false;
    }
}